

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbefec.cpp
# Opt level: O2

int DSDcc::HammingMBE::mbe_hamming1511(uchar *in,uchar *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int block;
  long lVar4;
  int iVar5;
  bool bVar6;
  
  block = 0;
  for (uVar1 = 0xe; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    block = block * 2 | (uint)in[uVar1];
  }
  uVar1 = 0;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    uVar3 = (long)((&hammingGenerator)[lVar4] & block) % 2 & 0xffffffff;
    iVar5 = 0xe;
    uVar2 = (&hammingGenerator)[lVar4] & block;
    while( true ) {
      bVar6 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar6) break;
      uVar3 = (ulong)((uint)uVar3 ^ (uint)(CONCAT44((int)uVar2 >> 0x1f,(int)uVar2 >> 1) % 2));
      uVar2 = (int)uVar2 >> 1;
    }
    uVar1 = uVar1 * 2 | (uint)uVar3;
  }
  if (0 < (int)uVar1) {
    block = block ^ *(uint *)(hammingMatrix + (ulong)uVar1 * 4);
  }
  for (uVar2 = 0xe; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    out[uVar2] = (byte)((uint)block >> 0xe) & 1;
    block = block * 2;
  }
  return (uint)(0 < (int)uVar1);
}

Assistant:

int HammingMBE::mbe_hamming1511(unsigned char *in, unsigned char *out)
{
    int i, j, errs, block, syndrome, stmp, stmp2;

    errs = 0;
    block = 0;

    for (i = 14; i >= 0; i--)
    {
        block <<= 1;
        block |= in[i];
    }

    syndrome = 0;

    for (i = 0; i < 4; i++)
    {
        syndrome <<= 1;
        stmp = block;
        stmp &= hammingGenerator[i];
        stmp2 = (stmp % 2);

        for (j = 0; j < 14; j++)
        {
            stmp >>= 1;
            stmp2 ^= (stmp % 2);
        }

        syndrome |= stmp2;
    }

    if (syndrome > 0)
    {
        errs++;
        block ^= hammingMatrix[syndrome];
    }

    for (i = 14; i >= 0; i--)
    {
        out[i] = (block & 0x4000) >> 14;
        block = block << 1;
    }

    return errs;
}